

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

char * __thiscall cs_impl::system_cs_ext::getenv(system_cs_ext *this,char *__name)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  ulong *local_60;
  undefined8 local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s = ::getenv(*(char **)__name);
  if (__s != (char *)0x0) {
    *(system_cs_ext **)this = this + 0x10;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)this,__s,__s + sVar2);
    return (char *)this;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x20);
  std::operator+(&local_40,"Environment variable \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (ulong *)*plVar4;
  puVar5 = (ulong *)(plVar4 + 2);
  if (local_60 == puVar5) {
    local_50 = *puVar5;
    uStack_48 = (undefined4)plVar4[3];
    uStack_44 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_60 = &local_50;
  }
  else {
    local_50 = *puVar5;
  }
  lVar1 = plVar4[1];
  *plVar4 = (long)puVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  *puVar3 = puVar3 + 2;
  if (local_60 == &local_50) {
    *(undefined4 *)(puVar3 + 2) = (undefined4)local_50;
    *(undefined4 *)((long)puVar3 + 0x14) = local_50._4_4_;
    *(undefined4 *)(puVar3 + 3) = uStack_48;
    *(undefined4 *)((long)puVar3 + 0x1c) = uStack_44;
  }
  else {
    *puVar3 = local_60;
    puVar3[2] = local_50;
  }
  puVar3[1] = lVar1;
  local_50 = local_50 & 0xffffffffffffff00;
  __cxa_throw(puVar3,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

string getenv(const string &name)
		{
			const char *str = std::getenv(name.c_str());
			if (str == nullptr)
				throw lang_error("Environment variable \"" + name + "\" is not exist.");
			return str;
		}